

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeat_end_matcher.hpp
# Opt level: O2

bool __thiscall
boost::xpressive::detail::repeat_end_matcher<mpl_::bool_<false>>::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (repeat_end_matcher<mpl_::bool_<false>> *this,
          match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *next)

{
  bool bVar1;
  char *pcVar2;
  sub_match_impl *psVar3;
  char *pcVar4;
  bool bVar5;
  int iVar6;
  
  iVar6 = *(int *)this;
  pcVar2 = (state->cur_)._M_current;
  psVar3 = state->sub_matches_;
  bVar1 = psVar3[iVar6].zero_width_;
  pcVar4 = psVar3[iVar6].begin_._M_current;
  if ((pcVar4 == pcVar2 & bVar1) == 1) {
    iVar6 = (*(next->
              super_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._vptr_matchable[2])(next);
    return SUB41(iVar6,0);
  }
  psVar3[iVar6].zero_width_ = pcVar4 == pcVar2;
  bVar5 = match_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
                    ();
  if (!bVar5) {
    psVar3[iVar6].zero_width_ = bVar1;
  }
  return bVar5;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            // prevent repeated zero-width sub-matches from causing infinite recursion
            sub_match_impl<BidiIter> &br = state.sub_match(this->mark_number_);

            if(br.zero_width_ && br.begin_ == state.cur_)
            {
                return next.skip_match(state);
            }

            bool old_zero_width = br.zero_width_;
            br.zero_width_ = (br.begin_ == state.cur_);

            if(this->match_(state, next, greedy_type()))
            {
                return true;
            }

            br.zero_width_ = old_zero_width;
            return false;
        }